

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O0

void __thiscall DSDcc::DSDNXDN::processPostFrame(DSDNXDN *this)

{
  int iVar1;
  ostream *this_00;
  long *in_RDI;
  DSDDecoder *unaff_retaddr;
  int dibit;
  
  if (*(int *)((long)in_RDI + 0x27c) < 10) {
    iVar1 = DSDSymbol::getDibit((DSDSymbol *)0x12a15e);
    if ((iVar1 == 0) || (iVar1 == 1)) {
      *(undefined1 *)((long)in_RDI + (long)*(int *)((long)in_RDI + 0x27c) + 0x265) = 1;
    }
    else {
      *(undefined1 *)((long)in_RDI + (long)*(int *)((long)in_RDI + 0x27c) + 0x265) = 3;
    }
    *(int *)((long)in_RDI + 0x27c) = *(int *)((long)in_RDI + 0x27c) + 1;
    if (*(int *)((long)in_RDI + 0x27c) == 10) {
      processFSW(this);
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"DSDNXDN::processPostFrame: out of sync (end)");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    *(undefined1 *)(*in_RDI + 0x701fd) = 0;
    DSDDecoder::resetFrameSync(unaff_retaddr);
    *(undefined1 *)((long)in_RDI + 0x264) = 0;
  }
  return;
}

Assistant:

void DSDNXDN::processPostFrame()
{
	if (m_symbolIndex < 10)
	{
	    int dibit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get dibit from symbol

        if ((dibit == 0) || (dibit == 1)) { // positives => 1 (+3)
            m_syncBuffer[m_symbolIndex] = 1;
        } else { // negatives => 3 (-3)
            m_syncBuffer[m_symbolIndex] = 3;
        }

		m_symbolIndex++;

		if (m_symbolIndex == 10) {
		    processFSW();
		}
	}
	else // out of sync => terminate
	{
        std::cerr << "DSDNXDN::processPostFrame: out of sync (end)" << std::endl;
        m_dsdDecoder->m_voice1On = false;
		m_dsdDecoder->resetFrameSync(); // end
		m_inSync = false;
	}
}